

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_pipeline(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long *in_RDI;
  Mat weight_data_r2;
  int k;
  int i;
  float *p;
  float *pt;
  Mat weight_data_transposed;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_000001b0;
  DeconvolutionDepthWise_x86 *in_stack_000001b8;
  Allocator *in_stack_fffffffffffffdc8;
  Mat *pMVar6;
  size_t in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  Mat *pMVar7;
  Mat *in_stack_fffffffffffffde0;
  Option *in_stack_fffffffffffffde8;
  void **ppvVar8;
  void *local_1e0;
  int *local_1d8;
  Allocator *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  Mat *in_stack_fffffffffffffe48;
  int local_198;
  int local_194;
  Mat *local_190;
  void *local_178;
  Mat local_170;
  int local_124;
  int local_120;
  int local_11c;
  byte *local_118;
  int local_104;
  undefined8 local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  Mat *local_e8;
  Mat *local_e0;
  undefined8 *local_d8;
  void **local_d0;
  Mat *local_c0;
  int local_b0;
  undefined4 local_ac;
  Mat *local_a8;
  Mat *local_a0;
  Mat *local_98;
  int local_90;
  undefined4 local_8c;
  Mat *local_88;
  int local_70;
  undefined4 local_6c;
  Mat *local_68;
  int local_50;
  undefined4 local_4c;
  void **local_48;
  int local_40;
  undefined4 local_3c;
  undefined8 *local_38;
  void *local_30;
  void *local_18;
  void *local_8;
  
  local_11c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  uVar4 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x110) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
  local_120 = ((int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                    (long)local_11c) /
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114))) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
  if ((local_120 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114) ==
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
    local_124 = 1;
    if (((in_RSI[0x27] & 1) != 0) && (local_124 = 1, local_120 % 4 == 0)) {
      local_124 = 4;
    }
    local_ec = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x194);
    pMVar6 = &local_170;
    local_f8 = 4;
    local_100 = 0;
    local_170.data = (void *)0x0;
    local_170.refcount = (int *)0x0;
    local_170.elemsize = 0;
    local_170.elempack = 0;
    local_170.allocator = (Allocator *)0x0;
    local_170.dims = 0;
    local_170.w = 0;
    local_170.h = 0;
    local_170.d = 0;
    local_170.c = 0;
    local_170.cstep = 0;
    local_e8 = pMVar6;
    Mat::create(in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    local_e0 = &local_170;
    local_178 = local_170.data;
    local_d8 = (undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x168);
    pMVar7 = (Mat *)*local_d8;
    local_190 = pMVar7;
    for (local_194 = 0;
        local_194 <
        (local_120 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) *
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114)) *
        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114); local_194 = local_194 + 1) {
      for (local_198 = 0; local_198 < local_11c; local_198 = local_198 + 1) {
        *(undefined4 *)((long)local_178 + (long)((local_11c + -1) - local_198) * 4) =
             *(undefined4 *)((long)&local_190->data + (long)local_198 * 4);
      }
      local_190 = (Mat *)((long)&local_190->data + (long)local_11c * 4);
      local_178 = (void *)((long)local_178 + (long)local_11c * 4);
    }
    if (local_124 == 4) {
      Mat::reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                   in_stack_fffffffffffffe38);
      convert_packing(pMVar6,pMVar7,local_194,in_stack_fffffffffffffde8);
      ppvVar8 = &local_1e0;
      local_d0 = ppvVar8;
      local_48 = ppvVar8;
      if (local_1d8 != (int *)0x0) {
        local_4c = 0xffffffff;
        LOCK();
        local_50 = *local_1d8;
        *local_1d8 = *local_1d8 + -1;
        UNLOCK();
        if (local_50 == 1) {
          if (CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40) == 0) {
            if (local_1e0 != (void *)0x0) {
              free(local_1e0);
            }
          }
          else {
            (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40) +
                        0x18))((long *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                               ,local_1e0);
          }
        }
      }
      *ppvVar8 = (void *)0x0;
      ppvVar8[2] = (void *)0x0;
      *(undefined4 *)(ppvVar8 + 3) = 0;
      *(undefined4 *)(ppvVar8 + 5) = 0;
      *(undefined4 *)((long)ppvVar8 + 0x2c) = 0;
      *(undefined4 *)(ppvVar8 + 6) = 0;
      *(undefined4 *)((long)ppvVar8 + 0x34) = 0;
      *(undefined4 *)(ppvVar8 + 7) = 0;
      ppvVar8[8] = (void *)0x0;
      ppvVar8[1] = (void *)0x0;
    }
    if (local_124 == 1) {
      pMVar6 = (Mat *)(in_RDI + 4);
      local_a8 = &local_170;
      local_a0 = pMVar6;
      local_98 = pMVar6;
      if (pMVar6 != local_a8) {
        if (local_170.refcount != (int *)0x0) {
          local_ac = 1;
          LOCK();
          local_b0 = *local_170.refcount;
          *local_170.refcount = *local_170.refcount + 1;
          UNLOCK();
        }
        pMVar7 = pMVar6;
        local_88 = pMVar6;
        if (in_RDI[5] != 0) {
          piVar1 = (int *)in_RDI[5];
          local_8c = 0xffffffff;
          LOCK();
          local_90 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_90 == 1) {
            if (in_RDI[8] == 0) {
              local_8 = pMVar6->data;
              if (local_8 != (void *)0x0) {
                free(local_8);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI[8] + 0x18))((long *)in_RDI[8],pMVar6->data);
            }
          }
        }
        pMVar6->data = (void *)0x0;
        pMVar6->elemsize = 0;
        pMVar6->elempack = 0;
        pMVar6->dims = 0;
        pMVar6->w = 0;
        pMVar6->h = 0;
        pMVar6->d = 0;
        pMVar6->c = 0;
        pMVar6->cstep = 0;
        pMVar6->refcount = (int *)0x0;
        pMVar7->data = local_a8->data;
        pMVar7->refcount = local_a8->refcount;
        pMVar7->elemsize = local_a8->elemsize;
        pMVar7->elempack = local_a8->elempack;
        pMVar7->allocator = local_a8->allocator;
        pMVar7->dims = local_a8->dims;
        pMVar7->w = local_a8->w;
        pMVar7->h = local_a8->h;
        pMVar7->d = local_a8->d;
        pMVar7->c = local_a8->c;
        pMVar7->cstep = local_a8->cstep;
        local_98 = pMVar7;
      }
    }
    local_104 = 0;
    pMVar6 = &local_170;
    if (local_170.refcount != (int *)0x0) {
      local_6c = 0xffffffff;
      LOCK();
      local_70 = *local_170.refcount;
      *local_170.refcount = *local_170.refcount + -1;
      UNLOCK();
      if (local_70 == 1) {
        local_c0 = pMVar6;
        local_68 = pMVar6;
        if (local_170.allocator == (Allocator *)0x0) {
          local_18 = local_170.data;
          if (local_170.data != (void *)0x0) {
            free(local_170.data);
          }
        }
        else {
          (*(local_170.allocator)->_vptr_Allocator[3])(local_170.allocator,local_170.data);
        }
      }
    }
    pMVar6->data = (void *)0x0;
    pMVar6->elemsize = 0;
    pMVar6->elempack = 0;
    pMVar6->dims = 0;
    pMVar6->w = 0;
    pMVar6->h = 0;
    pMVar6->d = 0;
    pMVar6->c = 0;
    pMVar6->cstep = 0;
    pMVar6->refcount = (int *)0x0;
  }
  else {
    local_118 = in_RSI;
    create_group_ops(in_stack_000001b8,in_stack_000001b0);
    if ((*local_118 & 1) != 0) {
      lVar2 = *(long *)(*in_RDI + -0x18);
      puVar5 = (undefined8 *)((long)in_RDI + lVar2 + 0x168);
      if (*(long *)((long)in_RDI + lVar2 + 0x170) != 0) {
        piVar1 = *(int **)((long)in_RDI + lVar2 + 0x170);
        local_3c = 0xffffffff;
        LOCK();
        local_40 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_40 == 1) {
          local_38 = puVar5;
          if (*(long *)((long)in_RDI + lVar2 + 0x188) == 0) {
            local_30 = (void *)*puVar5;
            if (local_30 != (void *)0x0) {
              free(local_30);
            }
          }
          else {
            plVar3 = *(long **)((long)in_RDI + lVar2 + 0x188);
            (**(code **)(*plVar3 + 0x18))(plVar3,*puVar5);
          }
        }
      }
      *puVar5 = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x178) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x180) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 400) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x194) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x198) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x19c) = 0;
      *(undefined4 *)((long)in_RDI + lVar2 + 0x1a0) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x1a8) = 0;
      *(undefined8 *)((long)in_RDI + lVar2 + 0x170) = 0;
    }
    local_104 = 0;
  }
  return local_104;
}

Assistant:

int DeconvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}